

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfx.cpp
# Opt level: O0

void __thiscall rw::MatFX::setBumpTexture(MatFX *this,Texture *t)

{
  int32 iVar1;
  int32 i;
  Texture *t_local;
  MatFX *this_local;
  
  iVar1 = getEffectIndex(this,1);
  if (-1 < iVar1) {
    if (this->fx[iVar1].field_1.bump.tex != (Texture *)0x0) {
      Texture::destroy(this->fx[iVar1].field_1.bump.tex);
    }
    this->fx[iVar1].field_1.bump.tex = t;
    if (t != (Texture *)0x0) {
      Texture::addRef(t);
    }
  }
  return;
}

Assistant:

void
MatFX::setBumpTexture(Texture *t)
{
	int32 i = this->getEffectIndex(BUMPMAP);
	if(i >= 0){
		if(this->fx[i].bump.tex)
			this->fx[i].bump.tex->destroy();
		this->fx[i].bump.tex = t;
		if(t)
			t->addRef();
	}
}